

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O1

expr_node * __thiscall expr_tree::sinDeriv(expr_tree *this,expr_node *node)

{
  expr_node *this_00;
  expr_node *_right;
  expr_value eStack_18;
  
  this_00 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&eStack_18,10);
  expr_node::expr_node(this_00,'\x05',&eStack_18);
  _right = Copy(node->right);
  this_00->right = _right;
  Link(this_00,(expr_node *)0x0,_right);
  return this_00;
}

Assistant:

expr_node* expr_tree::sinDeriv(const expr_node* node)
{
    auto deriv = new expr_node(OP, (long)COS);
    deriv->right = Copy(node->right);
    Link(deriv, nullptr, deriv->right);
    return deriv;
}